

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void triangle_textured(array<vec<3UL,_int>,_3UL> pts,array<vec<2UL,_double>,_3UL> uvs,
                      vector<double,_std::allocator<double>_> *zbuffer,TGAImage *image,Model *model)

{
  vec3i P_00;
  vec3i A;
  vec3i B;
  vec3i C;
  int iVar1;
  int iVar2;
  TGAColor TVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  reference pvVar7;
  int *piVar8;
  int *__b;
  double *pdVar9;
  reference pvVar10;
  reference pvVar11;
  double dVar12;
  TGAColor local_e1;
  undefined1 auStack_dc [3];
  TGAColor color;
  int i_2;
  vec2f uv;
  int i_1;
  undefined1 local_68 [8];
  vec3f bc_screen;
  vec3i P;
  int local_3c;
  int j;
  int i;
  vec2i clamp;
  vec2i bboxmax;
  vec2i bboxmin;
  Model *model_local;
  TGAImage *image_local;
  vector<double,_std::allocator<double>_> *zbuffer_local;
  
  iVar1 = std::numeric_limits<int>::max();
  iVar2 = std::numeric_limits<int>::max();
  vec<2UL,_int>::vec(&bboxmax,iVar1,iVar2);
  iVar1 = std::numeric_limits<int>::min();
  iVar2 = std::numeric_limits<int>::min();
  vec<2UL,_int>::vec(&clamp,iVar1,iVar2);
  sVar4 = TGAImage::get_width(image);
  sVar5 = TGAImage::get_height(image);
  vec<2UL,_int>::vec((vec<2UL,_int> *)&j,(int)sVar4 + -1,(int)sVar5 + -1);
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    for (P.z = 0; P.z < 2; P.z = P.z + 1) {
      P.y = 0;
      piVar6 = vec<2UL,_int>::operator[](&bboxmax,(long)P.z);
      pvVar7 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,(long)local_3c);
      piVar8 = vec<3UL,_int>::operator[](pvVar7,(long)P.z);
      piVar6 = std::min<int>(piVar6,piVar8);
      piVar6 = std::max<int>(&P.y,piVar6);
      iVar1 = *piVar6;
      piVar6 = vec<2UL,_int>::operator[](&bboxmax,(long)P.z);
      *piVar6 = iVar1;
      piVar6 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)&j,(long)P.z);
      piVar8 = vec<2UL,_int>::operator[](&clamp,(long)P.z);
      pvVar7 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,(long)local_3c);
      __b = vec<3UL,_int>::operator[](pvVar7,(long)P.z);
      piVar8 = std::max<int>(piVar8,__b);
      piVar6 = std::min<int>(piVar6,piVar8);
      iVar1 = *piVar6;
      piVar6 = vec<2UL,_int>::operator[](&clamp,(long)P.z);
      *piVar6 = iVar1;
    }
  }
  vec<3UL,_int>::vec((vec<3UL,_int> *)&bc_screen.z);
  for (bc_screen.z._0_4_ = bboxmax.x; bc_screen.z._0_4_ <= clamp.x;
      bc_screen.z._0_4_ = bc_screen.z._0_4_ + 1) {
    for (bc_screen.z._4_4_ = bboxmax.y; bc_screen.z._4_4_ <= clamp.y;
        bc_screen.z._4_4_ = bc_screen.z._4_4_ + 1) {
      pvVar7 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,0);
      A.x = pvVar7->x;
      A.y = pvVar7->y;
      A.z = pvVar7->z;
      pvVar7 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,1);
      B.x = pvVar7->x;
      B.y = pvVar7->y;
      B.z = pvVar7->z;
      pvVar7 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,2);
      C.x = pvVar7->x;
      C.y = pvVar7->y;
      C.z = pvVar7->z;
      P_00.y = bc_screen.z._4_4_;
      P_00.x = bc_screen.z._0_4_;
      P_00.z = P.x;
      barycentric((vec3f *)local_68,A,B,C,P_00);
      if (((0.0 <= (double)local_68) && (0.0 <= bc_screen.x)) && (0.0 <= bc_screen.y)) {
        P.x = 0;
        for (uv.y._4_4_ = 0; uv.y._4_4_ < 3; uv.y._4_4_ = uv.y._4_4_ + 1) {
          pvVar7 = std::array<vec<3UL,_int>,_3UL>::operator[](&pts,(long)uv.y._4_4_);
          piVar6 = vec<3UL,_int>::operator[](pvVar7,2);
          iVar1 = *piVar6;
          pdVar9 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_68,(long)uv.y._4_4_);
          P.x = (int)((double)iVar1 * *pdVar9) + P.x;
        }
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (zbuffer,(long)(bc_screen.z._0_4_ + bc_screen.z._4_4_ * 600));
        if (*pvVar10 < (double)P.x) {
          dVar12 = (double)P.x;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (zbuffer,(long)(bc_screen.z._0_4_ + bc_screen.z._4_4_ * 600));
          *pvVar10 = dVar12;
          vec<2UL,_double>::vec((vec<2UL,_double> *)(color.bgra + 1),0.0,0.0);
          for (_auStack_dc = 0; _auStack_dc < 3; _auStack_dc = _auStack_dc + 1) {
            pvVar11 = std::array<vec<2UL,_double>,_3UL>::operator[](&uvs,(long)_auStack_dc);
            dVar12 = pvVar11->x;
            pdVar9 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_68,(long)_auStack_dc);
            register0x00001200 = dVar12 * *pdVar9 + stack0xffffffffffffff28;
            std::array<vec<2UL,_double>,_3UL>::operator[](&uvs,(long)_auStack_dc);
            vec<3UL,_double>::operator[]((vec<3UL,_double> *)local_68,(long)_auStack_dc);
          }
          TVar3 = Model::diffuse(model,(vec2f *)(color.bgra + 1));
          local_e1.bgra = TVar3.bgra;
          local_e1.bytespp = TVar3.bytespp;
          TGAImage::set(image,(long)bc_screen.z._0_4_,(long)bc_screen.z._4_4_,&local_e1);
        }
      }
    }
  }
  return;
}

Assistant:

void triangle_textured(std::array<vec3i, 3> pts, std::array<vec2f, 3> uvs,
                       std::vector<double> &zbuffer, TGAImage &image, Model &model)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += static_cast<int>(pts[i][2] * bc_screen[i]);
            if (zbuffer[P.x + P.y * width] < P.z) {
                zbuffer[P.x + P.y * width] = P.z;
                vec2f uv{0, 0};
                for (int i = 0; i < 3; i++) {
                    uv.x += uvs[i].x * bc_screen[i];
                    uv.y += uvs[i].y * bc_screen[i];
                }
                TGAColor color = model.diffuse(uv);

                image.set(P.x, P.y, color);
            }
        }
    }
}